

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

Variable __thiscall LiteScript::String::GetMember(String *this,Memory *memory,char *name)

{
  void *pvVar1;
  undefined1 *puVar2;
  int iVar3;
  Object *pOVar4;
  char *in_RCX;
  uint *extraout_RDX;
  Variable *result;
  Variable VVar6;
  uint *puVar5;
  
  iVar3 = strcmp(in_RCX,"length");
  if (iVar3 == 0) {
    Memory::Create((Memory *)this,(Type *)name);
    pvVar1 = (memory->arr)._M_elems[1];
    pOVar4 = Variable::operator->((Variable *)this);
    puVar2 = (undefined1 *)pOVar4->data;
    *puVar2 = 0;
    *(int *)(puVar2 + 4) = (int)pvVar1;
    puVar5 = extraout_RDX;
  }
  else {
    VVar6 = Memory::Create((Memory *)this,(Type *)name);
    puVar5 = VVar6.nb_ref;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::String::GetMember(LiteScript::Memory& memory, const char * name) {
    if (strcmp(name, "length") == 0) {
        Variable result = memory.Create(Type::NUMBER);
        result->GetData<Number>() = Number((int)this->str.size());
        return result;
    }
    else {
        return memory.Create(_type_undefined);
    }
}